

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float __thiscall
pbrt::ConductorBxDF::PDF
          (ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Float FVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  float in_XMM2_Dd;
  Vector3<float> VVar9;
  Tuple3<pbrt::Vector3,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  local_28.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wo._8_56_;
  auVar6._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_28._0_8_ = vmovlps_avx(auVar6._0_16_);
  fVar4 = 0.0;
  if (((sampleFlags & Reflection) != Unset) &&
     (0.0 < local_28.z * wi.super_Tuple3<pbrt::Vector3,_float>.z)) {
    auVar5 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                        ZEXT416((uint)(this->mfDistrib).alpha_x));
    fVar4 = 0.0;
    if (0.001 <= auVar5._0_4_) {
      auVar5._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.x +
                     wo.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar5._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y +
                     wo.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar5._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z + 0.0;
      auVar5._12_4_ = in_XMM2_Dd + wo._12_4_;
      local_38.z = local_28.z + wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_38._0_8_ = vmovlps_avx(auVar5);
      if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
          ::reg == '\0') {
        iVar2 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg,CONCAT44(in_register_00000034,mode));
        if (iVar2 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x6b0) = *(long *)(in_FS_OFFSET + -0x6b0) + 1;
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_38.y * local_38.y)),ZEXT416((uint)local_38.x),
                               ZEXT416((uint)local_38.x));
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_38.z),ZEXT416((uint)local_38.z),auVar5);
      if ((auVar5._0_4_ == 0.0) && (!NAN(auVar5._0_4_))) {
        *(long *)(in_FS_OFFSET + -0x6b8) = *(long *)(in_FS_OFFSET + -0x6b8) + 1;
      }
      if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
          ::reg == '\0') {
        iVar2 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg);
        if (iVar2 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x6a0) = *(long *)(in_FS_OFFSET + -0x6a0) + 1;
      fVar4 = 0.0;
      auVar8 = ZEXT856(0);
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_38.y * local_28.y)),ZEXT416((uint)local_38.x),
                               ZEXT416((uint)local_28.x));
      auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_38.z),ZEXT416((uint)local_28.z));
      if (auVar5._0_4_ < 0.0) {
        *(long *)(in_FS_OFFSET + -0x6a8) = *(long *)(in_FS_OFFSET + -0x6a8) + 1;
      }
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_38.x),ZEXT416((uint)local_38.x),
                               ZEXT416((uint)(local_38.y * local_38.y)));
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_38.z),ZEXT416((uint)local_38.z),auVar1);
      if (((auVar1._0_4_ != 0.0) || (NAN(auVar1._0_4_))) && (0.0 < auVar5._0_4_)) {
        VVar9 = Normalize<float>((Vector3<float> *)&local_38);
        local_38.z = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar7._8_56_ = auVar8;
        local_38._0_8_ = vmovlps_avx(auVar7._0_16_);
        FVar3 = TrowbridgeReitzDistribution::PDF
                          (&this->mfDistrib,(Vector3f *)&local_28,(Vector3f *)&local_38);
        auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_28.y * local_38.y)),ZEXT416((uint)local_28.x),
                                 ZEXT416((uint)local_38.x));
        auVar5 = vfmadd132ss_fma(ZEXT416((uint)local_28.z),auVar5,ZEXT416((uint)local_38.z));
        fVar4 = FVar3 / (auVar5._0_4_ * 4.0);
      }
    }
  }
  return fVar4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (!SameHemisphere(wo, wi))
            return 0;
        if (mfDistrib.EffectivelySpecular())
            return 0;
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-6, LengthSquared(wh) == 0);
        CHECK_RARE(1e-6, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);
        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh));
    }